

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QString::fromUtf8(QString *__return_storage_ptr__,QString *this,QByteArrayView ba)

{
  QByteArrayView in;
  
  in.m_data = (storage_type *)ba.m_size;
  if (in.m_data == (storage_type *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (this == (QString *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"";
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    in.m_size = (qsizetype)this;
    QUtf8::convertToUnicode(__return_storage_ptr__,in);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::fromUtf8(QByteArrayView ba)
{
    if (ba.isNull())
        return QString();
    if (ba.isEmpty())
        return QString(DataPointer::fromRawData(&_empty, 0));
    return QUtf8::convertToUnicode(ba);
}